

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

void __thiscall ParameterBase::~ParameterBase(ParameterBase *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ParameterBase() {}